

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QRegularExpression *re)

{
  QRegularExpressionPrivate *pQVar1;
  long lVar2;
  QArrayData *data;
  size_t length;
  storage_type *in_RCX;
  long *in_RDX;
  char16_t *begin;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> local_60;
  QDebug local_58;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)re);
  pQVar1 = (re->d).d.ptr;
  *(undefined1 *)&pQVar1->errorCode = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QRegularExpression(";
  QString::fromUtf8(&local_48,(QString *)0x13,ba);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (re->d).d.ptr;
  if ((char)pQVar1->errorCode == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  lVar2 = *in_RDX;
  data = *(QArrayData **)(lVar2 + 8);
  begin = *(char16_t **)(lVar2 + 0x10);
  length = *(size_t *)(lVar2 + 0x18);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((QChar *)begin == (QChar *)0x0) {
    begin = L"";
  }
  QDebug::putString((QDebug *)re,(QChar *)begin,length);
  pQVar1 = (re->d).d.ptr;
  if ((char)pQVar1->errorCode == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar1 = (re->d).d.ptr;
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_48,(QString *)0x2,ba_00);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (re->d).d.ptr;
  if ((char)pQVar1->errorCode == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  local_60.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)(re->d).d.ptr;
  *(int *)&((QRegularExpressionPrivate *)local_60.d.ptr)->compiledPattern =
       *(int *)&((QRegularExpressionPrivate *)local_60.d.ptr)->compiledPattern + 1;
  operator<<((Stream *)&local_58,
             (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)SUB84(&local_60,0));
  QTextStream::operator<<(&(local_58.stream)->ts,')');
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug((QDebug *)&local_60);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  pQVar1 = (re->d).d.ptr;
  (re->d).d.ptr = (QRegularExpressionPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QRegularExpression &re)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QRegularExpression(" << re.pattern() << ", " << re.patternOptions() << ')';
    return debug;
}